

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall
xray_re::xr_partition::load_0(xr_partition *this,xr_reader *r,xr_bone_vec *all_bones)

{
  uint *puVar1;
  pointer ppxVar2;
  ulong uVar3;
  ulong uVar4;
  
  xr_reader::r_sz(r,&this->m_name);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  uVar4 = (ulong)*puVar1;
  if (uVar4 != 0) {
    do {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar3 = (ulong)*puVar1;
      ppxVar2 = (all_bones->
                super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      if ((ulong)((long)(all_bones->
                        super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar2 >> 3) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_bones,&ppxVar2[uVar3]->m_name);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void xr_partition::load_0(xr_reader& r, const xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u32(); n; --n)
		m_bones.push_back(all_bones.at(r.r_u32())->name());
}